

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * wasm::Path::getBinaryenBinaryTool(string *__return_storage_ptr__,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *name_local;
  
  local_18 = name;
  name_local = __return_storage_ptr__;
  getBinaryenBinDir_abi_cxx11_();
  std::operator+(__return_storage_ptr__,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string getBinaryenBinaryTool(const std::string& name) {
  return getBinaryenBinDir() + name;
}